

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBase.cpp
# Opt level: O2

void __thiscall DataBase::DataBase(DataBase *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *pmVar1;
  _Rb_tree_header *p_Var2;
  allocator local_4c;
  allocator local_4b;
  allocator local_4a;
  allocator local_49;
  allocator local_48;
  allocator local_47;
  allocator local_46;
  allocator local_45;
  allocator local_44;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  this->in_var_map =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
        *)0x0;
  this->sim_var_map =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
        *)0x0;
  std::
  queue<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::queue<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            (&this->updates_to_sim);
  std::__cxx11::string::string
            ((string *)this->sim_var_index,"/instrumentation/airspeed-indicator/indicated-speed-kt",
             &local_4c);
  std::__cxx11::string::string((string *)(this->sim_var_index + 1),"/sim/time/warp",&local_4b);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 2),"/controls/switches/magnetos",&local_4a);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 3),"/instrumentation/heading-indicator/offset-deg",
             &local_49);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 4),"/instrumentation/altimeter/indicated-altitude-ft",
             &local_48);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 5),"/instrumentation/altimeter/pressure-alt-ft",
             &local_47);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 6),
             "/instrumentation/attitude-indicator/indicated-pitch-deg",&local_46);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 7),
             "/instrumentation/attitude-indicator/indicated-roll-deg",&local_45);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 8),
             "/instrumentation/attitude-indicator/internal-pitch-deg",&local_44);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 9),
             "/instrumentation/attitude-indicator/internal-roll-deg",&local_43);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 10),"/instrumentation/encoder/indicated-altitude-ft",
             &local_42);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0xb),"/instrumentation/encoder/pressure-alt-ft",
             &local_41);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0xc),"/instrumentation/gps/indicated-altitude-ft",
             &local_40);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0xd),"/instrumentation/gps/indicated-ground-speed-kt",
             &local_3f);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0xe),"/instrumentation/gps/indicated-vertical-speed",
             &local_3e);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0xf),
             "/instrumentation/heading-indicator/indicated-heading-deg",&local_3d);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x10),
             "/instrumentation/magnetic-compass/indicated-heading-deg",&local_3c);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x11),
             "/instrumentation/slip-skid-ball/indicated-slip-skid",&local_3b);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x12),
             "/instrumentation/turn-indicator/indicated-turn-rate",&local_3a);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x13),
             "/instrumentation/vertical-speed-indicator/indicated-speed-fpm",&local_39);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x14),"/controls/flight/aileron",&local_38);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x15),"/controls/flight/elevator",&local_37);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x16),"/controls/flight/rudder",&local_36);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x17),"/controls/flight/flaps",&local_35);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x18),"/controls/engines/engine/throttle",&local_34);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x19),"/controls/engines/current-engine/throttle",
             &local_33);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x1a),"/controls/switches/master-avionics",&local_32);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x1b),"/controls/switches/starter",&local_31);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x1c),"/engines/active-engine/auto-start",&local_30);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x1d),"/controls/flight/speedbrake",&local_2f);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x1e),"/sim/model/c172p/brake-parking",&local_2e);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x1f),"/controls/engines/engine/primer",&local_2d);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x20),"/controls/engines/current-engine/mixture",
             &local_2c);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x21),"/controls/switches/master-bat",&local_2b);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x22),"/controls/switches/master-alt",&local_2a);
  std::__cxx11::string::string
            ((string *)(this->sim_var_index + 0x23),"/engines/engine/rpm",&local_29);
  this->is_running = false;
  (this->sim_var_map_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->sim_var_map_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->sim_var_map_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->sim_var_map_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->sim_var_map_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->in_var_map_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->in_var_map_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->in_var_map_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->in_var_map_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->in_var_map_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pmVar1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
            *)operator_new(0x30);
  p_Var2 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(pmVar1->_M_t)._M_impl = 0;
  *(undefined8 *)&(pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->in_var_map = pmVar1;
  pmVar1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
            *)operator_new(0x30);
  p_Var2 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(pmVar1->_M_t)._M_impl = 0;
  *(undefined8 *)&(pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->sim_var_map = pmVar1;
  return;
}

Assistant:

DataBase::DataBase() {
  this->in_var_map = new map<string, Variable *>();
  this->sim_var_map = new map<string, Variable *>();
}